

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursorPrivate::QTextCursorPrivate(QTextCursorPrivate *this,QTextCursorPrivate *rhs)

{
  QSharedData *in_RSI;
  QTextCursorPrivate *in_RDI;
  QTextCursorPrivate *c;
  
  c = in_RDI;
  QSharedData::QSharedData(in_RSI,&in_RDI->super_QSharedData);
  in_RDI->position =
       in_RSI[6].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i;
  in_RDI->anchor =
       in_RSI[7].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i;
  in_RDI->adjusted_anchor =
       in_RSI[8].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i;
  in_RDI->priv = *(QTextDocumentPrivate **)(in_RSI + 2);
  in_RDI->x = *(qreal *)(in_RSI + 4);
  in_RDI->currentCharFormat =
       in_RSI[9].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i;
  in_RDI->field_0x28 =
       in_RDI->field_0x28 & 0xfe |
       (byte)in_RSI[10].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i & 1;
  in_RDI->field_0x28 =
       in_RDI->field_0x28 & 0xfd |
       ((byte)in_RSI[10].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i >> 1 & 1) << 1;
  in_RDI->field_0x28 =
       in_RDI->field_0x28 & 0xfb |
       ((byte)in_RSI[10].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i >> 2 & 1) << 2;
  if (in_RDI->priv != (QTextDocumentPrivate *)0x0) {
    QTextDocumentPrivate::addCursor((QTextDocumentPrivate *)0x79f3c9,c);
  }
  return;
}

Assistant:

QTextCursorPrivate::QTextCursorPrivate(const QTextCursorPrivate &rhs)
    : QSharedData(rhs)
{
    position = rhs.position;
    anchor = rhs.anchor;
    adjusted_anchor = rhs.adjusted_anchor;
    priv = rhs.priv;
    x = rhs.x;
    currentCharFormat = rhs.currentCharFormat;
    visualNavigation = rhs.visualNavigation;
    keepPositionOnInsert = rhs.keepPositionOnInsert;
    changed = rhs.changed;
    if (priv != nullptr)
        priv->addCursor(this);
}